

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_fhandle_add(filemgr *file,void *fhandle)

{
  avl_node *paVar1;
  avl_node *in_RSI;
  long in_RDI;
  byte bVar2;
  avl_node *a;
  filemgr_fhandle_idx_node query;
  filemgr_fhandle_idx_node *item;
  bool ret;
  avl_cmp_func *in_stack_ffffffffffffffc8;
  avl_node *in_stack_ffffffffffffffd0;
  avl_tree *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x2e8));
  paVar1 = avl_search(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  bVar2 = paVar1 == (avl_node *)0x0;
  if ((bool)bVar2) {
    paVar1 = (avl_node *)calloc(1,0x20);
    paVar1->parent = in_RSI;
    avl_insert((avl_tree *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),paVar1,
               (avl_cmp_func *)in_stack_ffffffffffffffd8);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x2e8));
  return (bool)(bVar2 & 1);
}

Assistant:

bool filemgr_fhandle_add(struct filemgr *file, void *fhandle)
{
    bool ret;
    struct filemgr_fhandle_idx_node *item, query;
    struct avl_node *a;

    spin_lock(&file->fhandle_idx_lock);

    query.fhandle = fhandle;
    a = avl_search(&file->fhandle_idx, &query.avl, _fhandle_idx_cmp);
    if (!a) {
        // not exist, create a node and insert
        item = (struct filemgr_fhandle_idx_node *)calloc(1, sizeof(struct filemgr_fhandle_idx_node));
        item->fhandle = fhandle;
        avl_insert(&file->fhandle_idx, &item->avl, _fhandle_idx_cmp);
        ret = true;
    } else {
        ret = false;
    }

    spin_unlock(&file->fhandle_idx_lock);
    return ret;
}